

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CHog.h
# Opt level: O1

void __thiscall CHog::getFeatVect(CHog *this,double *featVect,int x,int y,int w,int h)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  long lVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  ulong uVar9;
  
  iVar1 = x + 1;
  iVar3 = y + 1;
  if (featVect == (double *)0x0) {
    lVar5 = (long)(h * w) * (long)this->hist[iVar3][iVar1].dim;
    uVar9 = 0xffffffffffffffff;
    if (-1 < (int)lVar5) {
      uVar9 = lVar5 * 8;
    }
    featVect = (double *)operator_new__(uVar9);
  }
  if (0 < h) {
    iVar8 = 0;
    iVar4 = 0;
    do {
      if (0 < w) {
        iVar6 = (this->histSizeY - y) + -2;
        if (iVar4 + iVar3 < this->histSizeY) {
          iVar6 = iVar4;
        }
        iVar7 = 0;
        do {
          iVar2 = (this->histSizeX - x) + -2;
          if (iVar1 + iVar7 < this->histSizeX) {
            iVar2 = iVar7;
          }
          lVar5 = (long)this->hist[iVar6 + iVar3][iVar2 + iVar1].dim;
          memcpy(featVect + (iVar8 + iVar7) * lVar5,this->hist[iVar6 + iVar3][iVar2 + iVar1].feat,
                 lVar5 << 3);
          iVar7 = iVar7 + 1;
        } while (w != iVar7);
      }
      iVar4 = iVar4 + 1;
      iVar8 = iVar8 + w;
    } while (iVar4 != h);
  }
  return;
}

Assistant:

void CHog::getFeatVect(double* featVect, int x, int y, int w, int h)
{
	//cout << "getting feature vector" << endl;
    x += 1;
    y += 1;
    int dx, dy;
    if(featVect==NULL)
        featVect = new double[w*h*hist[y][x].dim];
    for(int i=0; i<h; i++)
    {
        if(y+i>=histSizeY)
            dy = histSizeY-y-1;
        else
            dy = i;
        for(int j=0; j<w; j++)
        {
            if(x+j>=histSizeX)
                dx = histSizeX-x-1;
            else
                dx = j;
            memcpy(featVect+(i*w+j)*hist[y+dy][x+dx].dim, hist[y+dy][x+dx].feat, sizeof(double)*hist[y+dy][x+dx].dim);
        }
    }
	//cout << "feature vector got" << endl;
}